

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O2

void calc_ranges_all_cols<InputData<double,int>,WorkerMemory<ImputedData<int,double>,double,double>>
               (InputData<double,_int> *input_data,
               WorkerMemory<ImputedData<int,_double>,_double,_double> *workspace,
               ModelParams *model_params,double *ranges,double *saved_xmin,double *saved_xmax)

{
  ColumnSampler<double> *this;
  size_t *col;
  bool bVar1;
  size_t sVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  this = &workspace->col_sampler;
  ColumnSampler<double>::prepare_full_pass(this);
  col = &workspace->col_chosen;
  while( true ) {
    bVar1 = ColumnSampler<double>::sample_col(this,col);
    if (!bVar1) break;
    get_split_range<InputData<double,int>,WorkerMemory<ImputedData<int,double>,double,double>>
              (workspace,input_data,model_params);
    if (workspace->unsplittable == true) {
      ColumnSampler<double>::drop_col(this,*col);
      sVar2 = *col;
      ranges[sVar2] = 0.0;
      dVar4 = 0.0;
      dVar5 = 0.0;
    }
    else {
      dVar4 = workspace->xmin;
      dVar5 = workspace->xmax;
      sVar2 = workspace->col_chosen;
      ranges[sVar2] = dVar5 - dVar4;
      pdVar3 = workspace->tree_kurtoses;
      if ((pdVar3 != (double *)0x0) || (pdVar3 = input_data->col_weights, pdVar3 != (double *)0x0))
      {
        dVar6 = (dVar5 - dVar4) * pdVar3[sVar2];
        if (dVar6 <= 1e-100) {
          dVar6 = 1e-100;
        }
        ranges[sVar2] = dVar6;
      }
    }
    if (saved_xmin != (double *)0x0) {
      saved_xmin[sVar2] = dVar4;
      saved_xmax[sVar2] = dVar5;
    }
  }
  return;
}

Assistant:

void calc_ranges_all_cols(InputData &input_data, WorkerMemory &workspace, ModelParams &model_params,
                          double *restrict ranges, double *restrict saved_xmin, double *restrict saved_xmax)
{
    workspace.col_sampler.prepare_full_pass();
    while (workspace.col_sampler.sample_col(workspace.col_chosen))
    {
        get_split_range(workspace, input_data, model_params);

        if (workspace.unsplittable) {
            workspace.col_sampler.drop_col(workspace.col_chosen);
            ranges[workspace.col_chosen] = 0;
            if (saved_xmin != NULL) {
                saved_xmin[workspace.col_chosen] = 0;
                saved_xmax[workspace.col_chosen] = 0;
            }
        }
        else {
            ranges[workspace.col_chosen] = workspace.xmax - workspace.xmin;
            if (workspace.tree_kurtoses != NULL) {
                ranges[workspace.col_chosen] *= workspace.tree_kurtoses[workspace.col_chosen];
                ranges[workspace.col_chosen] = std::fmax(ranges[workspace.col_chosen], 1e-100);
            }
            else if (input_data.col_weights != NULL) {
                ranges[workspace.col_chosen] *= input_data.col_weights[workspace.col_chosen];
                ranges[workspace.col_chosen] = std::fmax(ranges[workspace.col_chosen], 1e-100);
            }
            if (saved_xmin != NULL) {
                saved_xmin[workspace.col_chosen] = workspace.xmin;
                saved_xmax[workspace.col_chosen] = workspace.xmax;
            }
        }
    }
}